

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::
basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
::begin_document(basic_bson_parser<jsoncons::binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::allocator<char>_>
                 *this,json_visitor *visitor,error_code *ec)

{
  int iVar1;
  type_conflict tVar2;
  size_type sVar3;
  parse_mode *__args;
  bson_errc __e;
  size_t in_RSI;
  ser_context *in_RDI;
  binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *unaff_retaddr;
  type_conflict length;
  size_t n;
  uint8_t buf [4];
  error_code *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>
  *in_stack_ffffffffffffffe0;
  ser_context *data;
  
  data = in_RDI;
  sVar3 = std::vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_>::
          size((vector<jsoncons::bson::parse_state,_std::allocator<jsoncons::bson::parse_state>_> *)
               (in_RDI + 0x17));
  __e = (bson_errc)sVar3;
  iVar1 = bson_options_common::max_nesting_depth
                    ((bson_options_common *)
                     (in_RDI[9]._vptr_ser_context[-3] + (long)&in_RDI[9]._vptr_ser_context));
  if (iVar1 < (int)__e) {
    std::error_code::operator=
              ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__e);
    *(undefined1 *)&in_RDI[1]._vptr_ser_context = 0;
  }
  else {
    __args = (parse_mode *)
             binary_iterator_source<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
             ::read<std::random_access_iterator_tag>(unaff_retaddr,(value_type *)data,in_RSI);
    if (__args == (parse_mode *)0x4) {
      tVar2 = binary::little_to_native<int,jsoncons::detail::endian>(&stack0xffffffffffffffe4,4);
      basic_json_visitor<char>::begin_object
                ((basic_json_visitor<char> *)CONCAT44(tVar2,in_stack_ffffffffffffffd0),
                 (semantic_tag)(__e >> 0x18),in_RDI,in_stack_ffffffffffffffb8);
      *(byte *)&in_RDI[1]._vptr_ser_context =
           (*(byte *)((long)&in_RDI[1]._vptr_ser_context + 2) ^ 0xff) & 1;
      std::vector<jsoncons::bson::parse_state,std::allocator<jsoncons::bson::parse_state>>::
      emplace_back<jsoncons::bson::parse_mode,int&,unsigned_long&>
                (in_stack_ffffffffffffffe0,__args,(int *)CONCAT44(tVar2,2),
                 (unsigned_long *)CONCAT44(__e,in_stack_ffffffffffffffc8));
    }
    else {
      std::error_code::operator=
                ((error_code *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),__e);
      *(undefined1 *)&in_RDI[1]._vptr_ser_context = 0;
    }
  }
  return;
}

Assistant:

void begin_document(json_visitor& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(static_cast<int>(state_stack_.size()) > options_.max_nesting_depth()))
        {
            ec = bson_errc::max_nesting_depth_exceeded;
            more_ = false;
            return;
        } 

        uint8_t buf[sizeof(int32_t)]; 
        std::size_t n = source_.read(buf, sizeof(int32_t));
        if (JSONCONS_UNLIKELY(n != sizeof(int32_t)))
        {
            ec = bson_errc::unexpected_eof;
            more_ = false;
            return;
        }

        auto length = binary::little_to_native<int32_t>(buf, sizeof(buf));

        visitor.begin_object(semantic_tag::none, *this, ec);
        more_ = !cursor_mode_;
        state_stack_.emplace_back(parse_mode::document,length,n);
    }